

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ulong uVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  char cVar8;
  ImGuiID IVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect group_bb;
  ImRect local_40;
  ImVec2 local_30;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar4 = (GImGui->GroupStack).Data;
  lVar10 = (long)(GImGui->GroupStack).Size;
  IVar2 = (pIVar3->DC).CursorMaxPos;
  fVar14 = IVar2.x;
  fVar15 = IVar2.y;
  local_40.Min.x = pIVar4[lVar10 + -1].BackupCursorPos.x;
  local_40.Min.y = pIVar4[lVar10 + -1].BackupCursorPos.y;
  uVar5 = CONCAT44(~-(uint)(local_40.Min.y <= fVar15) & (uint)local_40.Min.y,
                   ~-(uint)(local_40.Min.x <= fVar14) & (uint)local_40.Min.x) |
          CONCAT44((uint)fVar15 & -(uint)(local_40.Min.y <= fVar15),
                   (uint)fVar14 & -(uint)(local_40.Min.x <= fVar14));
  local_40.Max.x = (float)uVar5;
  local_40.Max.y = (float)(uVar5 >> 0x20);
  (pIVar3->DC).CursorPos.x = local_40.Min.x;
  (pIVar3->DC).CursorPos.y = local_40.Min.y;
  fVar16 = pIVar4[lVar10 + -1].BackupCursorMaxPos.x;
  fVar17 = pIVar4[lVar10 + -1].BackupCursorMaxPos.y;
  uVar12 = -(uint)(fVar14 <= fVar16);
  uVar13 = -(uint)(fVar15 <= fVar17);
  (pIVar3->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar13 & (uint)fVar15,~uVar12 & (uint)fVar14) |
               CONCAT44((uint)fVar17 & uVar13,(uint)fVar16 & uVar12));
  (pIVar3->DC).Indent.x = pIVar4[lVar10 + -1].BackupIndent.x;
  (pIVar3->DC).GroupOffset.x = pIVar4[lVar10 + -1].BackupGroupOffset.x;
  (pIVar3->DC).CurrLineSize = pIVar4[lVar10 + -1].BackupCurrLineSize;
  fVar14 = pIVar4[lVar10 + -1].BackupCurrLineTextBaseOffset;
  (pIVar3->DC).CurrLineTextBaseOffset = fVar14;
  if (pIVar7->LogEnabled == true) {
    pIVar7->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar4[lVar10 + -1].EmitItem != true) goto LAB_00126561;
  fVar15 = (pIVar3->DC).PrevLineTextBaseOffset;
  uVar12 = -(uint)(fVar14 <= fVar15);
  (pIVar3->DC).CurrLineTextBaseOffset = (float)(~uVar12 & (uint)fVar14 | (uint)fVar15 & uVar12);
  local_30.y = local_40.Max.y - local_40.Min.y;
  local_30.x = local_40.Max.x - local_40.Min.x;
  ItemSize(&local_30,-1.0);
  bVar11 = false;
  ItemAdd(&local_40,0,(ImRect *)0x0);
  IVar9 = pIVar7->ActiveId;
  if (pIVar4[lVar10 + -1].BackupActiveIdIsAlive != IVar9) {
    bVar11 = IVar9 != 0 && pIVar7->ActiveIdIsAlive == IVar9;
  }
  if (pIVar4[lVar10 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar8 = pIVar7->ActiveIdPreviousFrameIsAlive;
  }
  else {
    cVar8 = '\0';
  }
  if (bVar11) {
LAB_00126505:
    (pIVar3->DC).LastItemId = IVar9;
  }
  else if (cVar8 != '\0') {
    IVar9 = pIVar7->ActiveIdPreviousFrame;
    goto LAB_00126505;
  }
  IVar2.y = local_40.Min.y;
  IVar2.x = local_40.Min.x;
  IVar6.y = local_40.Max.y;
  IVar6.x = local_40.Max.x;
  (pIVar3->DC).LastItemRect.Min = IVar2;
  (pIVar3->DC).LastItemRect.Max = IVar6;
  if ((bVar11) && (pIVar7->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar3->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar12 = (pIVar3->DC).LastItemStatusFlags;
  (pIVar3->DC).LastItemStatusFlags = uVar12 | 0x20;
  if ((cVar8 != '\0') && (pIVar7->ActiveId != pIVar7->ActiveIdPreviousFrame)) {
    (pIVar3->DC).LastItemStatusFlags = uVar12 | 0x60;
  }
LAB_00126561:
  (pIVar7->GroupStack).Size = (pIVar7->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}